

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAutoTableElement.cpp
# Opt level: O2

void __thiscall
FillCellHelper::FillCellHelper
          (FillCellHelper *this,QAbstractItemModel *tableModel,int section,Orientation orientation,
          QSize iconSz)

{
  bool bVar1;
  Int IVar2;
  QVariant local_70;
  QVariant *local_50;
  QString *local_48;
  QVariant *local_40;
  QVariant *local_38;
  
  this->iconSize = iconSz;
  (**(code **)(*(long *)tableModel + 0xa0))(&this->cellDecoration);
  local_38 = &this->cellDecoration;
  (**(code **)(*(long *)tableModel + 0xa0))(&this->cellFont,tableModel,section,orientation,6);
  local_40 = &this->cellFont;
  (**(code **)(*(long *)tableModel + 0xa0))(&local_70,tableModel,section,orientation,0);
  local_48 = &this->cellText;
  QVariant::toString();
  QVariant::~QVariant(&local_70);
  local_50 = &this->foreground;
  (**(code **)(*(long *)tableModel + 0xa0))(local_50,tableModel,section,orientation,9);
  (**(code **)(*(long *)tableModel + 0xa0))(&this->background,tableModel,section,orientation,8);
  (**(code **)(*(long *)tableModel + 0xa0))(&local_70,tableModel,section,orientation,7);
  IVar2 = QVariant::toInt((bool *)&local_70);
  (this->alignment).i = IVar2;
  QVariant::~QVariant(&local_70);
  (**(code **)(*(long *)tableModel + 0xa0))
            (&this->decorationAlignment,tableModel,section,orientation,0x2d535fb1);
  (**(code **)(*(long *)tableModel + 0xa0))(&local_70,tableModel,section,orientation,0x2d535fb2);
  bVar1 = (bool)QVariant::toBool();
  QVariant::~QVariant(&local_70);
  this->nonBreakableLines = bVar1;
  (this->span).wd = 1;
  (this->span).ht = 1;
  QTextCursor::QTextCursor(&this->cellCursor);
  return;
}

Assistant:

FillCellHelper(QAbstractItemModel *tableModel, int section, Qt::Orientation orientation, QSize iconSz)
        : iconSize(iconSz)
        , cellDecoration(tableModel->headerData(section, orientation, Qt::DecorationRole))
        , cellFont(tableModel->headerData(section, orientation, Qt::FontRole))
        , cellText(tableModel->headerData(section, orientation, Qt::DisplayRole).toString())
        , foreground(tableModel->headerData(section, orientation, Qt::ForegroundRole))
        , background(tableModel->headerData(section, orientation, Qt::BackgroundRole))
        , alignment(Qt::Alignment(tableModel->headerData(section, orientation, Qt::TextAlignmentRole).toInt()))
        , decorationAlignment(tableModel->headerData(section, orientation, KDReports::AutoTableElement::DecorationAlignmentRole))
        , nonBreakableLines(tableModel->headerData(section, orientation, KDReports::AutoTableElement::NonBreakableLinesRole).toBool())
        , span(1, 1)
    {
    }